

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O0

void __thiscall groundupdbext::MemoryKeyValueStore::clear(MemoryKeyValueStore *this)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> *this_00;
  pointer pKVar3;
  MemoryKeyValueStore *this_local;
  
  pIVar2 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  std::
  unordered_map<groundupdb::HashedValue,_groundupdb::EncodedValue,_groundupdbext::HighwayHash,_std::equal_to<groundupdb::HashedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_groundupdb::EncodedValue>_>_>
  ::clear(&pIVar2->m_keyValueStore);
  pIVar2 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->(&this->mImpl);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&pIVar2->m_cachedStore);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
             ::operator->(&this->mImpl);
    this_00 = std::
              optional<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>_>
              ::operator->(&pIVar2->m_cachedStore);
    pKVar3 = std::
             unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
             ::get(this_00);
    (*(pKVar3->super_Store)._vptr_Store[7])();
  }
  return;
}

Assistant:

void
MemoryKeyValueStore::clear()
{
  mImpl->m_keyValueStore.clear();
  if (mImpl->m_cachedStore) {
    mImpl->m_cachedStore->get()->clear();
  }
}